

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O0

void HFilter(SmoothParams *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  uint16_t delta_2;
  uint16_t delta_1;
  uint16_t delta;
  int x;
  int r;
  int w;
  uint32_t scale;
  uint16_t *out;
  uint16_t *in;
  SmoothParams *p_local;
  
  puVar4 = p->end_;
  puVar5 = p->average_;
  iVar1 = p->scale_;
  iVar2 = p->width_;
  iVar3 = p->radius_;
  for (x = 0; x <= iVar3; x = x + 1) {
    puVar5[x] = (uint16_t)
                ((uint)(ushort)(puVar4[x + iVar3 + -1] + puVar4[iVar3 - x]) * iVar1 >> 0x10);
  }
  for (; x < iVar2 - iVar3; x = x + 1) {
    puVar5[x] = (uint16_t)
                ((uint)(ushort)(puVar4[x + iVar3] - puVar4[(x - iVar3) + -1]) * iVar1 >> 0x10);
  }
  for (; x < iVar2; x = x + 1) {
    puVar5[x] = (uint16_t)
                ((uint)(ushort)((puVar4[iVar2 + -1] * 2 - puVar4[((iVar2 * 2 + -2) - iVar3) - x]) -
                               puVar4[(x - iVar3) + -1]) * iVar1 >> 0x10);
  }
  return;
}

Assistant:

static void HFilter(SmoothParams* const p) {
  const uint16_t* const in = p->end_;
  uint16_t* const out = p->average_;
  const uint32_t scale = p->scale_;
  const int w = p->width_;
  const int r = p->radius_;

  int x;
  for (x = 0; x <= r; ++x) {   // left mirroring
    const uint16_t delta = in[x + r - 1] + in[r - x];
    out[x] = (delta * scale) >> FIX;
  }
  for (; x < w - r; ++x) {     // bulk middle run
    const uint16_t delta = in[x + r] - in[x - r - 1];
    out[x] = (delta * scale) >> FIX;
  }
  for (; x < w; ++x) {         // right mirroring
    const uint16_t delta =
        2 * in[w - 1] - in[2 * w - 2 - r - x] - in[x - r - 1];
    out[x] = (delta * scale) >> FIX;
  }
}